

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O1

int32_t get_gpr_store_offset_as_int(Instruction *instr)

{
  long lVar1;
  int32_t iVar2;
  long lVar3;
  
  if (instr->kind != SB) {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 == 0x10) goto LAB_0014492d;
      lVar1 = lVar3 + 4;
    } while (instr->kind != *(InstructionKind *)(_ZGRN12_GLOBAL__N_110gpr_storesE_ + lVar3 + 4));
    if (lVar3 == 0x10) {
LAB_0014492d:
      __assert_fail("is_gpr_store(instr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                    ,0x107,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
    }
  }
  if (instr->n_src == '\x03') {
    iVar2 = InstructionAtom::get_imm(instr->src + 1);
    return iVar2;
  }
  __assert_fail("instr.n_src == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                ,0x108,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
}

Assistant:

int32_t get_gpr_store_offset_as_int(const Instruction& instr) {
  assert(is_gpr_store(instr));
  assert(instr.n_src == 3);
  return instr.src[1].get_imm();
}